

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

void __thiscall
pybind11::detail::argument_loader<std::__cxx11::string,pybind11::array&>::
call<void,pybind11::detail::void_type,pybind11_init_pyhenson(pybind11::module_&)::__7&>
          (argument_loader<std::__cxx11::string,pybind11::array&> *this,type *f)

{
  data_t dVar1;
  undefined8 uVar2;
  data_t dVar3;
  size_t sVar4;
  NameMap *this_00;
  runtime_error *this_01;
  anon_class_1_1_89917c4a *this_02;
  data_t local_c8;
  undefined1 local_c0 [64];
  Value v;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)(this + 8));
  v.impl_.
  super_copy_assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  .
  super_move_assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  .
  super_assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  .
  super_move_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  .
  super_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  .
  super_base<(mpark::detail::Trait)1,_int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .data_.head_.value = (alt<0UL,_int>)0;
  v.impl_.
  super_copy_assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  .
  super_move_assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  .
  super_assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  .
  super_move_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  .
  super_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  .
  super_base<(mpark::detail::Trait)1,_int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .index_ = 0;
  local_c0._0_8_ = *(undefined8 *)&((data_t *)(*(long *)this + 0x38))->dummy_;
  if ((data_t)local_c0._0_8_ != (data_t)0x0) {
    *(long *)local_c0._0_8_ = *(long *)local_c0._0_8_ + 1;
  }
  npy_format_descriptor<float,_void>::dtype();
  uVar2 = local_c0._0_8_;
  dVar3 = local_c8;
  object::~object((object *)&local_c8.head_);
  object::~object((object *)local_c0);
  if ((data_t)uVar2 == dVar3) {
    dVar3 = (data_t)array::mutable_data<>((array *)this);
    sVar4 = array::size((array *)this);
    local_c0._32_8_ = array::strides((array *)this,0);
    local_c0._8_4_ = 1;
    local_c0._0_8_ = dVar3;
LAB_001aabb7:
    local_c0._16_8_ = 4;
  }
  else {
    local_c0._0_8_ = *(undefined8 *)&((data_t *)(*(long *)this + 0x38))->dummy_;
    if ((data_t)local_c0._0_8_ != (data_t)0x0) {
      *(long *)local_c0._0_8_ = *(long *)local_c0._0_8_ + 1;
    }
    npy_format_descriptor<double,_void>::dtype();
    uVar2 = local_c0._0_8_;
    dVar3 = local_c8;
    object::~object((object *)&local_c8.head_);
    object::~object((object *)local_c0);
    if ((data_t)uVar2 == dVar3) {
      dVar3 = (data_t)array::mutable_data<>((array *)this);
      sVar4 = array::size((array *)this);
      local_c0._32_8_ = array::strides((array *)this,0);
      local_c0._8_4_ = 2;
      local_c0._0_8_ = dVar3;
    }
    else {
      dVar3 = *(data_t *)&((data_t *)(*(long *)this + 0x38))->dummy_;
      if (dVar3 != (data_t)0x0) {
        *(long *)dVar3 = *(long *)dVar3 + 1;
      }
      local_c0._0_8_ = dVar3;
      npy_format_descriptor<int,_void>::dtype();
      dVar1 = local_c8;
      object::~object((object *)&local_c8.head_);
      object::~object((object *)local_c0);
      if (dVar3 == dVar1) {
        dVar3 = (data_t)array::mutable_data<>((array *)this);
        sVar4 = array::size((array *)this);
        local_c0._32_8_ = array::strides((array *)this,0);
        local_c0._8_4_ = 3;
        local_c0._0_8_ = dVar3;
        goto LAB_001aabb7;
      }
      dVar3 = *(data_t *)&((data_t *)(*(long *)this + 0x38))->dummy_;
      if (dVar3 != (data_t)0x0) {
        *(long *)dVar3 = *(long *)dVar3 + 1;
      }
      local_c0._0_8_ = dVar3;
      npy_format_descriptor<long,_void>::dtype();
      object::~object((object *)&local_c8.head_);
      object::~object((object *)local_c0);
      if (dVar3 != local_c8) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Unknown array dtype");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      dVar3 = (data_t)array::mutable_data<>((array *)this);
      sVar4 = array::size((array *)this);
      local_c0._32_8_ = array::strides((array *)this,0);
      local_c0._8_4_ = 4;
      local_c0._0_8_ = dVar3;
    }
    local_c0._16_8_ = 8;
  }
  local_c0._40_8_ = (element_type *)0x0;
  local_c0._48_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c0._24_8_ = sVar4;
  mpark::
  variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=<henson::Array,_0,_5UL,_henson::Array,_0>(&v,(Array *)local_c0);
  this_02 = (anon_class_1_1_89917c4a *)(local_c0 + 0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_02);
  this_00 = anon_func::anon_class_1_1_89917c4a::operator()(this_02);
  mpark::detail::
  copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  ::copy_constructor((copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                      *)local_c0,
                     (copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                      *)&v);
  henson::NameMap::add(this_00,&local_40,(Value *)local_c0);
  mpark::detail::
  destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  ::destroy((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
             *)local_c0);
  mpark::detail::
  destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  ::destroy((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
             *)&v);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

enable_if_t<std::is_void<Return>::value, void_type> call(Func &&f) && {
        std::move(*this).template call_impl<remove_cv_t<Return>>(
            std::forward<Func>(f), indices{}, Guard{});
        return void_type();
    }